

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

void __thiscall QtMWidgets::PickerPrivate::drawTick(PickerPrivate *this,QRect *r,QPainter *p)

{
  QPen *pQVar1;
  QPen pen;
  QPen local_30 [8];
  undefined8 local_28;
  undefined8 uStack_20;
  
  QPainter::save();
  QPainter::setRenderHint((RenderHint)p,true);
  pQVar1 = (QPen *)QPainter::pen();
  QPen::QPen(local_30,pQVar1);
  QPen::setWidth((int)local_30);
  QPen::setCapStyle((PenCapStyle)local_30);
  QPainter::setPen((QPen *)p);
  QPainter::setViewport((QRect *)p);
  local_28 = 0;
  uStack_20 = 0x600000005;
  QPainter::setWindow((QRect *)p);
  local_28 = 0x400000000;
  uStack_20 = 0x600000002;
  QPainter::drawLines((QLine *)p,(int)&local_28);
  local_28 = 0x600000002;
  uStack_20 = 0x100000005;
  QPainter::drawLines((QLine *)p,(int)&local_28);
  QPainter::restore();
  QPen::~QPen(local_30);
  return;
}

Assistant:

void
PickerPrivate::drawTick( const QRect & r, QPainter * p )
{
	p->save();

	p->setRenderHint( QPainter::Antialiasing );

	QPen pen = p->pen();
	pen.setWidth( 2 );
	pen.setCapStyle( Qt::RoundCap );
	p->setPen( pen );

	p->setViewport( r );
	p->setWindow( 0, 0, 6, 7 );
	p->drawLine( 0, 4, 2, 6 );
	p->drawLine( 2, 6, 5, 1 );

	p->restore();
}